

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O3

bool GLRParser::isMarkerMovedRight(Production *originalProduction,Production *productionMovedRight)

{
  size_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  string *psVar7;
  string *psVar8;
  undefined8 uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  string previoussymbol;
  long *local_78;
  size_t local_70;
  long local_68 [2];
  undefined1 *local_58;
  char *local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  ulong local_38;
  
  pvVar5 = Production::getToP_abi_cxx11_(originalProduction);
  pvVar6 = Production::getToP_abi_cxx11_(productionMovedRight);
  if ((long)(pvVar5->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(pvVar5->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start ==
      (long)(pvVar6->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(pvVar6->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start) {
    psVar7 = Production::getFromP_abi_cxx11_(originalProduction);
    psVar8 = Production::getFromP_abi_cxx11_(productionMovedRight);
    sVar1 = psVar7->_M_string_length;
    if ((sVar1 == psVar8->_M_string_length) &&
       ((sVar1 == 0 ||
        (iVar4 = bcmp((psVar7->_M_dataplus)._M_p,(psVar8->_M_dataplus)._M_p,sVar1), iVar4 == 0)))) {
      __first1 = (pvVar5->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      __last1 = (pvVar5->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      __first2 = (pvVar6->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      if ((long)__last1 - (long)__first1 ==
          (long)(pvVar6->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)__first2) {
        bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                          (__first1,__last1,__first2);
        if (bVar3) {
          return false;
        }
        __first1 = (pvVar5->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        __last1 = (pvVar5->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      }
      local_58 = &local_48;
      local_50 = (char *)0x0;
      local_48 = 0;
      if (__last1 == __first1) {
        return true;
      }
      lVar10 = 0;
      uVar12 = 0;
      uVar11 = 0;
      do {
        pbVar2 = (pvVar6->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(pvVar6->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar12
           ) goto LAB_00122286;
        sVar1 = *(size_t *)((long)&__first1->_M_string_length + lVar10);
        if ((sVar1 != *(size_t *)((long)&pbVar2->_M_string_length + lVar10)) ||
           ((sVar1 != 0 &&
            (iVar4 = bcmp(*(void **)((long)&(__first1->_M_dataplus)._M_p + lVar10),
                          *(void **)((long)&(pbVar2->_M_dataplus)._M_p + lVar10),sVar1), iVar4 != 0)
            ))) {
          getMarker_abi_cxx11_();
          sVar1 = *(size_t *)((long)&__first1->_M_string_length + lVar10);
          local_38 = uVar11;
          if (sVar1 == local_70) {
            if (sVar1 == 0) {
              bVar3 = true;
            }
            else {
              iVar4 = bcmp(*(void **)((long)&(__first1->_M_dataplus)._M_p + lVar10),local_78,sVar1);
              bVar3 = iVar4 == 0;
            }
          }
          else {
            bVar3 = false;
          }
          if (local_78 != local_68) {
            operator_delete(local_78,local_68[0] + 1);
          }
          if (!bVar3) {
            if ((local_38 & 1) != 0) {
              pbVar2 = (pvVar5->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(pvVar5->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <=
                  uVar12) {
LAB_00122286:
                uVar9 = std::__throw_out_of_range_fmt
                                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                   ,uVar12);
                if (local_58 != &local_48) {
                  operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
                }
                _Unwind_Resume(uVar9);
              }
              if ((local_50 == *(char **)((long)&pbVar2->_M_string_length + lVar10)) &&
                 ((local_50 == (char *)0x0 ||
                  (iVar4 = bcmp(local_58,*(void **)((long)&(pbVar2->_M_dataplus)._M_p + lVar10),
                                (size_t)local_50), iVar4 == 0)))) {
                pbVar2 = (pvVar6->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                if ((ulong)((long)(pvVar6->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)
                    <= uVar12) goto LAB_00122286;
                getMarker_abi_cxx11_();
                sVar1 = *(size_t *)((long)&pbVar2->_M_string_length + lVar10);
                if (sVar1 == local_70) {
                  if (sVar1 == 0) {
                    bVar3 = true;
                  }
                  else {
                    iVar4 = bcmp(*(void **)((long)&(pbVar2->_M_dataplus)._M_p + lVar10),local_78,
                                 sVar1);
                    bVar3 = iVar4 == 0;
                  }
                }
                else {
                  bVar3 = false;
                }
                if (local_78 != local_68) {
                  operator_delete(local_78,local_68[0] + 1);
                }
                if (bVar3) {
                  uVar11 = 0;
                  std::__cxx11::string::_M_replace((ulong)&local_58,0,local_50,0x14a3fc);
                  goto LAB_00122236;
                }
              }
            }
            bVar3 = false;
            goto LAB_00122261;
          }
          if ((ulong)((long)(pvVar6->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar6->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar12)
          goto LAB_00122286;
          uVar11 = CONCAT71((int7)((ulong)local_78 >> 8),1);
          std::__cxx11::string::_M_assign((string *)&local_58);
        }
LAB_00122236:
        uVar12 = uVar12 + 1;
        __first1 = (pvVar5->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        lVar10 = lVar10 + 0x20;
        if ((ulong)((long)(pvVar5->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)__first1 >> 5) <=
            uVar12) {
          bVar3 = true;
LAB_00122261:
          if (local_58 != &local_48) {
            operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
            return bVar3;
          }
          return bVar3;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool GLRParser::isMarkerMovedRight(Production *originalProduction, Production *productionMovedRight) {
    const auto &originalProductionTo = originalProduction->getToP();
    const auto &productionMovedRightTo = productionMovedRight->getToP();

    if (originalProductionTo.size() != productionMovedRightTo.size() ||
        originalProduction->getFromP() != productionMovedRight->getFromP() ||
        originalProductionTo == productionMovedRightTo) {
        return false;
    }

    bool previousMarker = false;
    std::string previoussymbol;
    for (int i = 0; i < originalProductionTo.size(); ++i) {
        if (originalProductionTo.at(i) != productionMovedRightTo.at(i)) {

            if (originalProductionTo.at(i) == getMarker()) {
                // Case: This is the original marker
                previousMarker = true;
                previoussymbol = productionMovedRightTo.at(i);

            } else if (previousMarker &&
                       previoussymbol == originalProductionTo.at(i) &&
                       productionMovedRightTo.at(i) == getMarker()) {
                // Case: This is the moved marker
                previoussymbol = "";
                previousMarker = false;

            } else {
                return false;
            }
        }
    }
    return true;
}